

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_databases.cpp
# Opt level: O2

void duckdb::DuckDBDatabasesFun::RegisterFunction(BuiltinFunctions *set)

{
  allocator local_209;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_208;
  string local_1e8;
  TableFunction local_1c8;
  
  ::std::__cxx11::string::string((string *)&local_1e8,"duckdb_databases",&local_209);
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TableFunction::TableFunction
            (&local_1c8,&local_1e8,(vector<duckdb::LogicalType,_true> *)&local_208,
             DuckDBDatabasesFunction,DuckDBDatabasesBind,DuckDBDatabasesInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1c8);
  TableFunction::~TableFunction(&local_1c8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_208);
  ::std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

void DuckDBDatabasesFun::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(
	    TableFunction("duckdb_databases", {}, DuckDBDatabasesFunction, DuckDBDatabasesBind, DuckDBDatabasesInit));
}